

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  allocator local_51;
  string local_50 [48];
  string *local_20;
  string *port_local;
  string *host_local;
  StreamingListener *this_local;
  
  local_20 = port;
  port_local = host;
  host_local = (string *)this;
  EmptyTestEventListener::EmptyTestEventListener(&this->super_EmptyTestEventListener);
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_00190c90;
  this->sockfd_ = -1;
  std::__cxx11::string::string((string *)&this->host_name_,(string *)port_local);
  std::__cxx11::string::string((string *)&this->port_num_,(string *)local_20);
  MakeConnection(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"gtest_streaming_protocol_version=1.0\n",&local_51);
  Send(this,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

StreamingListener(const string& host, const string& port)
      : sockfd_(-1), host_name_(host), port_num_(port) {
    MakeConnection();
    Send("gtest_streaming_protocol_version=1.0\n");
  }